

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

shared_ptr<AssemblyCode::AssemblyCommand> createStore(CTemp *source,int offset,CTemp *beginSP)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  int *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<AssemblyCode::AssemblyCommand> sVar2;
  undefined1 local_1c [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  local_1c._0_4_ = -(int)beginSP;
  std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst,IRT::CTemp&,int,IRT::CTemp&>
            ((CTemp *)(local_1c + 4),in_RCX,(CTemp *)local_1c);
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (source->name)._M_dataplus._M_p = (pointer)local_1c._4_8_;
  (source->name)._M_string_length = (size_type)_Var1._M_pi;
  local_1c._4_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)source;
  return (shared_ptr<AssemblyCode::AssemblyCommand>)
         sVar2.super___shared_ptr<AssemblyCode::AssemblyCommand,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssemblyCode::AssemblyCommand> createStore(IRT::CTemp& source, int offset, IRT::CTemp& beginSP) {
    return std::make_shared<AssemblyCode::MoveRegToMemByRegPlusConst>(beginSP, -offset, source);
}